

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O0

Element __thiscall ui::LedPanel::Render(LedPanel *this)

{
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Element EVar2;
  shared_ptr<ftxui::Node> *local_190;
  Decorator local_140;
  allocator<std::shared_ptr<ftxui::Node>_> local_11a;
  undefined1 local_119;
  shared_ptr<ftxui::Node> local_118;
  allocator<char> local_101;
  string local_100;
  shared_ptr<ftxui::Node> local_e0 [2];
  allocator<char> local_b9;
  string local_b8;
  ftxui *local_98;
  undefined1 local_90 [32];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  shared_ptr<ftxui::Node> local_50;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_40;
  Element local_28;
  LedPanel *this_local;
  
  local_119 = 1;
  local_98 = (ftxui *)local_90;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Select a LED:",&local_b9);
  ftxui::text((ftxui *)local_90,&local_b8);
  local_98 = (ftxui *)(local_90 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100," ",&local_101);
  ftxui::text((ftxui *)local_e0,&local_100);
  peVar1 = std::__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(in_RSI + 0x48));
  (*peVar1->_vptr_ComponentBase[2])(&local_118);
  ftxui::hbox<std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>>
            ((ftxui *)(local_90 + 0x10),local_e0,&local_118);
  local_98 = (ftxui *)local_70;
  ftxui::separator();
  local_98 = (ftxui *)local_60;
  peVar1 = std::__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(in_RSI + 0x58));
  (*peVar1->_vptr_ComponentBase[2])(local_60);
  local_119 = 0;
  local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_90;
  local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
  std::allocator<std::shared_ptr<ftxui::Node>_>::allocator(&local_11a);
  __l._M_len = (size_type)
               local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  __l._M_array = (iterator)
                 local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_40,__l,&local_11a);
  ftxui::vbox((ftxui *)&local_28,&local_40);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_140,
             ftxui::frame);
  ftxui::operator|((ftxui *)this,&local_28,&local_140);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_140);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_28);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_40);
  std::allocator<std::shared_ptr<ftxui::Node>_>::~allocator(&local_11a);
  local_190 = &local_50;
  do {
    local_190 = local_190 + -1;
    std::shared_ptr<ftxui::Node>::~shared_ptr(local_190);
  } while (local_190 != (shared_ptr<ftxui::Node> *)local_90);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_118);
  std::shared_ptr<ftxui::Node>::~shared_ptr(local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    return vbox({
               text("Select a LED:"),
               hbox(text(" "), radiobox_->Render()),
               separator(),
               led_tab_->Render(),
           }) |
           frame;
  }